

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowDemoWindow(bool *p_open)

{
  bool bVar1;
  int user_key_index;
  ImGuiContext *pIVar2;
  float fVar3;
  double dVar4;
  ImVec2 local_44;
  uint local_3c;
  ImGuiIO *pIStack_38;
  ImGuiBackendFlags backend_flags;
  ImGuiIO *io;
  ImVec2 local_24;
  ImVec2 local_1c;
  uint local_14;
  bool *pbStack_10;
  ImGuiWindowFlags window_flags;
  bool *p_open_local;
  
  pbStack_10 = p_open;
  pIVar2 = GetCurrentContext();
  if (pIVar2 == (ImGuiContext *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_demo.cpp"
                  ,0xc5,"void ImGui::ShowDemoWindow(bool *)");
  }
  if ((ShowDemoWindow::show_app_documents & 1U) != 0) {
    ShowExampleAppDocuments(&ShowDemoWindow::show_app_documents);
  }
  if ((ShowDemoWindow::show_app_main_menu_bar & 1U) != 0) {
    ShowExampleAppMainMenuBar();
  }
  if ((ShowDemoWindow::show_app_console & 1U) != 0) {
    ShowExampleAppConsole(&ShowDemoWindow::show_app_console);
  }
  if ((ShowDemoWindow::show_app_log & 1U) != 0) {
    ShowExampleAppLog(&ShowDemoWindow::show_app_log);
  }
  if ((ShowDemoWindow::show_app_layout & 1U) != 0) {
    ShowExampleAppLayout(&ShowDemoWindow::show_app_layout);
  }
  if ((ShowDemoWindow::show_app_property_editor & 1U) != 0) {
    ShowExampleAppPropertyEditor(&ShowDemoWindow::show_app_property_editor);
  }
  if ((ShowDemoWindow::show_app_long_text & 1U) != 0) {
    ShowExampleAppLongText(&ShowDemoWindow::show_app_long_text);
  }
  if ((ShowDemoWindow::show_app_auto_resize & 1U) != 0) {
    ShowExampleAppAutoResize(&ShowDemoWindow::show_app_auto_resize);
  }
  if ((ShowDemoWindow::show_app_constrained_resize & 1U) != 0) {
    ShowExampleAppConstrainedResize(&ShowDemoWindow::show_app_constrained_resize);
  }
  if ((ShowDemoWindow::show_app_simple_overlay & 1U) != 0) {
    ShowExampleAppSimpleOverlay(&ShowDemoWindow::show_app_simple_overlay);
  }
  if ((ShowDemoWindow::show_app_window_titles & 1U) != 0) {
    ShowExampleAppWindowTitles(&ShowDemoWindow::show_app_window_titles);
  }
  if ((ShowDemoWindow::show_app_custom_rendering & 1U) != 0) {
    ShowExampleAppCustomRendering(&ShowDemoWindow::show_app_custom_rendering);
  }
  if ((ShowDemoWindow::show_app_metrics & 1U) != 0) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if ((ShowDemoWindow::show_app_style_editor & 1U) != 0) {
    Begin("Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  if ((ShowDemoWindow::show_app_about & 1U) != 0) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  local_14 = (uint)((ShowDemoWindow::no_titlebar & 1U) != 0);
  if ((ShowDemoWindow::no_scrollbar & 1U) != 0) {
    local_14 = local_14 | 8;
  }
  if ((ShowDemoWindow::no_menu & 1U) == 0) {
    local_14 = local_14 | 0x400;
  }
  if ((ShowDemoWindow::no_move & 1U) != 0) {
    local_14 = local_14 | 4;
  }
  if ((ShowDemoWindow::no_resize & 1U) != 0) {
    local_14 = local_14 | 2;
  }
  if ((ShowDemoWindow::no_collapse & 1U) != 0) {
    local_14 = local_14 | 0x20;
  }
  if ((ShowDemoWindow::no_nav & 1U) != 0) {
    local_14 = local_14 | 0xc0000;
  }
  if ((ShowDemoWindow::no_background & 1U) != 0) {
    local_14 = local_14 | 0x80;
  }
  if ((ShowDemoWindow::no_bring_to_front & 1U) != 0) {
    local_14 = local_14 | 0x2000;
  }
  if ((ShowDemoWindow::no_close & 1U) != 0) {
    pbStack_10 = (bool *)0x0;
  }
  ImVec2::ImVec2(&local_1c,650.0,20.0);
  ImVec2::ImVec2(&local_24,0.0,0.0);
  SetNextWindowPos(&local_1c,4,&local_24);
  ImVec2::ImVec2((ImVec2 *)((long)&io + 4),550.0,680.0);
  SetNextWindowSize((ImVec2 *)((long)&io + 4),4);
  bVar1 = Begin("Dear ImGui Demo",pbStack_10,local_14);
  if (bVar1) {
    fVar3 = GetFontSize();
    PushItemWidth(fVar3 * -12.0);
    bVar1 = BeginMenuBar();
    if (bVar1) {
      bVar1 = BeginMenu("Menu",true);
      if (bVar1) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar1 = BeginMenu("Examples",true);
      if (bVar1) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar1 = BeginMenu("Tools",true);
      if (bVar1) {
        MenuItem("Metrics",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar1 = CollapsingHeader("Help",0);
    if (bVar1) {
      Text("PROGRAMMER GUIDE:");
      BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("Please see the comments in imgui.cpp.");
      BulletText("Please see the examples/ application.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Enable \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar1 = CollapsingHeader("Configuration",0);
    if (bVar1) {
      pIStack_38 = GetIO();
      bVar1 = TreeNode("Configuration##2");
      if (bVar1) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",(uint *)pIStack_38,1);
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",(uint *)pIStack_38,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",(uint *)pIStack_38,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",(uint *)pIStack_38,0x10);
        if ((pIStack_38->ConfigFlags & 0x10U) != 0) {
          dVar4 = GetTime();
          fVar3 = fmodf((float)dVar4,0.4);
          if (fVar3 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          user_key_index = GetKeyIndex(0xc);
          bVar1 = IsKeyPressed(user_key_index,true);
          if (bVar1) {
            pIStack_38->ConfigFlags = pIStack_38->ConfigFlags & 0xffffffef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",(uint *)pIStack_38,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTextCursorBlink",&pIStack_38->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting")
        ;
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIStack_38->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",
                 &pIStack_38->ConfigWindowsMoveFromTitleBarOnly);
        Checkbox("io.MouseDrawCursor",&pIStack_38->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        TreePop();
        Separator();
      }
      bVar1 = TreeNode("Backend Flags");
      if (bVar1) {
        HelpMarker(
                  "Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities."
                  );
        local_3c = pIStack_38->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",&local_3c,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",&local_3c,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",&local_3c,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",&local_3c,8);
        TreePop();
        Separator();
      }
      bVar1 = TreeNode("Style");
      if (bVar1) {
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar1 = TreeNode("Capture/Logging");
      if (bVar1) {
        TextWrapped(
                   "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded."
                   );
        HelpMarker(
                  "Try opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        TextWrapped(
                   "You can also call ImGui::LogText() to output directly to the log without a visual output."
                   );
        ImVec2::ImVec2(&local_44,0.0,0.0);
        bVar1 = Button("Copy \"Hello, world!\" to clipboard",&local_44);
        if (bVar1) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar1 = CollapsingHeader("Window options",0);
    if (bVar1) {
      Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
      SameLine(150.0,-1.0);
      Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
      SameLine(300.0,-1.0);
      Checkbox("No menu",&ShowDemoWindow::no_menu);
      Checkbox("No move",&ShowDemoWindow::no_move);
      SameLine(150.0,-1.0);
      Checkbox("No resize",&ShowDemoWindow::no_resize);
      SameLine(300.0,-1.0);
      Checkbox("No collapse",&ShowDemoWindow::no_collapse);
      Checkbox("No close",&ShowDemoWindow::no_close);
      SameLine(150.0,-1.0);
      Checkbox("No nav",&ShowDemoWindow::no_nav);
      SameLine(300.0,-1.0);
      Checkbox("No background",&ShowDemoWindow::no_background);
      Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowColumns();
    ShowDemoWindowMisc();
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!"); // Exceptionally add an extra assert here for people confused with initial dear imgui setup

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_documents = false;
    static bool show_app_main_menu_bar = false;
    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);
    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)             { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_style_editor)        { ImGui::Begin("Style Editor", &show_app_style_editor); ImGui::ShowStyleEditor(); ImGui::End(); }
    if (show_app_about)               { ImGui::ShowAboutWindow(&show_app_about); }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file. Typically this isn't required! We only do it to make the Demo applications a little more welcoming.
    ImGui::SetNextWindowPos(ImVec2(650, 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default.
    //ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.65f);    // Use 2/3 of the space for widgets and 1/3 for labels (default)
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);           // Use fixed width for labels (by passing a negative value), the rest goes to widgets. We choose a width proportional to our font size.

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Tools"))
        {
            ImGui::MenuItem("Metrics", NULL, &show_app_metrics);
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("Please see the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("Please see the comments in imgui.cpp.");
        ImGui::BulletText("Please see the examples/ application.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Enable 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Required back-end to feed in gamepad inputs in io.NavInputs[] and set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse) // Create a way to restore this flag otherwise we could be stuck completely!
            {
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", (unsigned int *)&io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct back-end to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Set to false to disable blinking cursor, for users who consider it distracting");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor for you. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker("Those flags are set by the back-ends (imgui_impl_xxx files) to specify their capabilities.");
            ImGuiBackendFlags backend_flags = io.BackendFlags; // Make a local copy to avoid modifying actual back-end flags.
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos", (unsigned int *)&backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", (unsigned int *)&backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            ImGui::TextWrapped("The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.");
            HelpMarker("Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();
            ImGui::TextWrapped("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        ImGui::Checkbox("No titlebar", &no_titlebar); ImGui::SameLine(150);
        ImGui::Checkbox("No scrollbar", &no_scrollbar); ImGui::SameLine(300);
        ImGui::Checkbox("No menu", &no_menu);
        ImGui::Checkbox("No move", &no_move); ImGui::SameLine(150);
        ImGui::Checkbox("No resize", &no_resize); ImGui::SameLine(300);
        ImGui::Checkbox("No collapse", &no_collapse);
        ImGui::Checkbox("No close", &no_close); ImGui::SameLine(150);
        ImGui::Checkbox("No nav", &no_nav); ImGui::SameLine(300);
        ImGui::Checkbox("No background", &no_background);
        ImGui::Checkbox("No bring to front", &no_bring_to_front);
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowColumns();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::End();
}